

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O0

uintptr_t ngx_radix32tree_find(ngx_radix_tree_t *tree,uint32_t key)

{
  ngx_radix_node_t *local_28;
  ngx_radix_node_t *node;
  uintptr_t value;
  uint32_t bit;
  uint32_t key_local;
  ngx_radix_tree_t *tree_local;
  
  value._0_4_ = 0x80000000;
  node = (ngx_radix_node_t *)0xffffffffffffffff;
  local_28 = tree->root;
  while (local_28 != (ngx_radix_node_t *)0x0) {
    if (local_28->value != 0xffffffffffffffff) {
      node = (ngx_radix_node_t *)local_28->value;
    }
    if ((key & (uint)value) == 0) {
      local_28 = local_28->left;
    }
    else {
      local_28 = local_28->right;
    }
    value._0_4_ = (uint)value >> 1;
  }
  return (uintptr_t)node;
}

Assistant:

uintptr_t
ngx_radix32tree_find(ngx_radix_tree_t *tree, uint32_t key)
{
    uint32_t           bit;
    uintptr_t          value;
    ngx_radix_node_t  *node;

    bit = 0x80000000;
    value = NGX_RADIX_NO_VALUE;
    node = tree->root;

    while (node) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            value = node->value;
        }

        if (key & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;
    }

    return value;
}